

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

double __thiscall mp::internal::TextReader<fmt::Locale>::ReadDouble(TextReader<fmt::Locale> *this)

{
  char *__nptr;
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  char *end;
  char *local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  SkipSpace(this);
  __nptr = (this->super_ReaderBase).ptr_;
  uVar2 = 0;
  uVar3 = 0;
  if (*__nptr != '\n') {
    local_38 = (char *)0x0;
    dVar1 = strtod_l(__nptr,&local_38,(__locale_t)(this->locale_).super_Locale.locale_);
    uVar2 = SUB84(dVar1,0);
    uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
    (this->super_ReaderBase).ptr_ = local_38;
    if (local_38 != __nptr) goto LAB_0012faf1;
  }
  local_28.field_1.values_ = (Value *)&local_38;
  local_38 = (char *)0x0;
  uStack_30 = 0;
  local_28.types_ = 0;
  DoReportError(this,(this->super_ReaderBase).token_,(CStringRef)0x172508,&local_28);
LAB_0012faf1:
  return (double)CONCAT44(uVar3,uVar2);
}

Assistant:

double ReadDouble() {
    SkipSpace();
    const char *start = ptr_;
    double value = 0;
    if (*ptr_ != '\n')
      value = locale_.strtod(ptr_);
    if (ptr_ == start)
      ReportError("expected double");
    return value;
  }